

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

int ifstream_readBinaryFile(ifstream_t *self,char *filename)

{
  _func_void_void_ptr *p_Var1;
  _func_void_void_ptr_uint8_t_ptr_uint32_t *p_Var2;
  uint8_t *__ptr;
  FILE *__stream;
  size_t sVar3;
  int *piVar4;
  int iVar5;
  
  if (filename == (char *)0x0 || self == (ifstream_t *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar5 = -1;
  }
  else {
    __ptr = (uint8_t *)malloc(0x2000);
    iVar5 = -1;
    if (__ptr != (uint8_t *)0x0) {
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        free(__ptr);
      }
      else {
        p_Var1 = (self->handler).open;
        if (p_Var1 != (_func_void_void_ptr *)0x0) {
          (*p_Var1)((self->handler).arg);
        }
        do {
          do {
            sVar3 = fread(__ptr,1,0x2000,__stream);
          } while (sVar3 == 0);
          p_Var2 = (self->handler).write;
          if (p_Var2 != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0) {
            (*p_Var2)((self->handler).arg,__ptr,(uint32_t)sVar3);
          }
        } while (0x1fff < sVar3);
        p_Var1 = (self->handler).close;
        if (p_Var1 != (_func_void_void_ptr *)0x0) {
          (*p_Var1)((self->handler).arg);
        }
        free(__ptr);
        fclose(__stream);
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int ifstream_readBinaryFile(ifstream_t *self,const char *filename)
{
   if( (self != 0) && (filename != 0) ){
      uint32_t chunkLen = 0;
      char *chunk;
      chunk = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      if( chunk != 0 ){
         FILE* fh = fopen(filename,"r");
         if (fh != 0){
            if(self->handler.open != 0){
               self->handler.open(self->handler.arg);
            }
            while(1){
               size_t len = fread(&chunk[0], 1, IFSTREAM_BLOCK_SIZE, fh);
               if (len > 0)
               {
                  chunkLen = (uint32_t) len;
                  if(self->handler.write != 0){
                     self->handler.write(self->handler.arg,(uint8_t*)chunk, chunkLen);
                  }
                  if (len < IFSTREAM_BLOCK_SIZE)
                  {
                     break; //done
                  }
               }
            }
            if(self->handler.close != 0){
               self->handler.close(self->handler.arg);
            }
            if (chunk != 0) free(chunk);
            fclose(fh);
            return 0;
         }
      }
      if (chunk != 0) free(chunk);
   }
   else{
      errno = EINVAL;
   }
   return -1;
}